

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_vtlb.c
# Opt level: O2

_Bool unicorn_fill_tlb_arm
                (CPUState *cs,vaddr address,int size,MMUAccessType rw,int mmu_idx,_Bool probe,
                uintptr_t retaddr)

{
  uint uVar1;
  uc_struct_conflict7 *puVar2;
  void *pvVar3;
  char cVar4;
  ulong uVar5;
  bool bVar6;
  uint uVar7;
  byte bVar8;
  list_item *plVar9;
  uc_tlb_entry e;
  
  puVar2 = cs->uc;
  plVar9 = (list_item *)(puVar2->hook + 0x11);
  bVar8 = 0x12;
  if (rw != MMU_INST_FETCH) {
    bVar8 = rw == MMU_DATA_STORE | 0x10;
  }
  bVar6 = false;
  do {
    do {
      do {
        plVar9 = plVar9->next;
        if ((plVar9 == (list_item *)0x0) || (pvVar3 = plVar9->data, pvVar3 == (void *)0x0)) {
          if (bVar6) goto LAB_00527bfc;
          e.paddr = (long)puVar2->init_target_page->mask & address;
          if (rw == MMU_INST_FETCH) {
            e.perms = UC_PROT_EXEC;
            uVar5 = 4;
            goto LAB_00527bc5;
          }
          if (rw == MMU_DATA_STORE) {
            e.perms = UC_PROT_WRITE;
            uVar5 = 2;
            goto LAB_00527bbb;
          }
          if (rw == MMU_DATA_LOAD) {
            e.perms = UC_PROT_READ;
            uVar5 = 1;
            goto LAB_00527bb3;
          }
          e.perms = UC_PROT_NONE;
          goto LAB_00527b9e;
        }
      } while (*(char *)((long)pvVar3 + 0x14) != '\0');
    } while ((address < *(ulong *)((long)pvVar3 + 0x18) || *(ulong *)((long)pvVar3 + 0x20) < address
             ) && (*(ulong *)((long)pvVar3 + 0x18) <= *(ulong *)((long)pvVar3 + 0x20)));
    cVar4 = (**(code **)((long)pvVar3 + 0x28))
                      (puVar2,(long)puVar2->init_target_page->mask & address,bVar8,&e,
                       *(undefined8 *)((long)pvVar3 + 0x30));
    bVar6 = true;
  } while (cVar4 == '\0');
LAB_00527b9e:
  if (rw == MMU_INST_FETCH) {
    uVar5 = (ulong)e.perms;
LAB_00527bc5:
    uVar7 = (uint)uVar5;
    uVar5 = uVar5 >> 2 & 0x3f;
  }
  else if (rw == MMU_DATA_STORE) {
    uVar5 = (ulong)e.perms;
LAB_00527bbb:
    uVar7 = (uint)uVar5;
    uVar5 = uVar5 >> 1 & 0x7f;
  }
  else {
    if (rw != MMU_DATA_LOAD) goto LAB_00527bfc;
    uVar5 = (ulong)e.perms;
LAB_00527bb3:
    uVar7 = (uint)uVar5;
  }
  if ((uVar5 & 1) != 0) {
    uVar1 = puVar2->init_target_page->mask;
    tlb_set_page_arm(cs,(uint)address & uVar1,(long)(int)uVar1 & e.paddr,uVar7 & 7,mmu_idx,-uVar1);
    return true;
  }
LAB_00527bfc:
  if (probe) {
    return false;
  }
  puVar2 = cs->uc;
  puVar2->invalid_error = 0x15;
  puVar2->invalid_addr = address & 0xffffffff;
  cpu_exit(puVar2->cpu);
  cpu_loop_exit_restore_arm(cs,retaddr);
}

Assistant:

bool unicorn_fill_tlb(CPUState *cs, vaddr address, int size,
                      MMUAccessType rw, int mmu_idx,
                      bool probe, uintptr_t retaddr)
{
    bool handled = false;
    bool ret = false;
    struct uc_struct *uc = cs->uc;
    uc_tlb_entry e;
    struct hook *hook;
    HOOK_FOREACH_VAR_DECLARE;

    HOOK_FOREACH(uc, hook, UC_HOOK_TLB_FILL) {
        if (hook->to_delete) {
            continue;
        }
        if (!HOOK_BOUND_CHECK(hook, address)) {
            continue;
        }
        handled = true;
        if ((ret = ((uc_cb_tlbevent_t)hook->callback)(uc, address & TARGET_PAGE_MASK, rw_to_mem_type(rw), &e, hook->user_data))) {
            break;
        }
    }

    if (handled && !ret) {
        goto tlb_miss;
    }

    if (!handled) {
        e.paddr = address & TARGET_PAGE_MASK;
        switch (rw) {
        case MMU_DATA_LOAD:
            e.perms = UC_PROT_READ;
            break;
        case MMU_DATA_STORE:
            e.perms = UC_PROT_WRITE;
            break;
        case MMU_INST_FETCH:
            e.perms = UC_PROT_EXEC;
            break;
        default:
            e.perms = 0;
            break;
        }
    }

    switch (rw) {
    case MMU_DATA_LOAD:
        ret = e.perms & UC_PROT_READ;
        break;
    case MMU_DATA_STORE:
        ret = e.perms & UC_PROT_WRITE;
        break;
    case MMU_INST_FETCH:
        ret = e.perms & UC_PROT_EXEC;
        break;
    default:
        ret = false;
        break;
    }

    if (ret) {
        tlb_set_page(cs, address & TARGET_PAGE_MASK, e.paddr & TARGET_PAGE_MASK, perms_to_prot(e.perms), mmu_idx, TARGET_PAGE_SIZE);
        return true;
    }

tlb_miss:
    if (probe) {
        return false;
    }
    raise_mmu_exception(cs, address, rw, retaddr);
    return false;
}